

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
env_infrastructure_t
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,environment_t *env,timer_manager_factory_t *timer_factory,
          error_logger_shptr_t *error_logger,coop_listener_unique_ptr_t *coop_listener,
          mbox_t *stats_distribution_mbox)

{
  environment_t *env_00;
  timer_manager_factory_t *env_01;
  mbox_t local_90;
  intrusive_ptr_t<so_5::abstract_message_box_t> local_88;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
  local_80;
  outliving_reference_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t> local_78
  ;
  unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_> local_70;
  so_5 local_68 [8];
  outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t> local_60;
  shared_ptr<so_5::error_logger_t> local_58 [2];
  mbox_t *local_38;
  mbox_t *stats_distribution_mbox_local;
  coop_listener_unique_ptr_t *coop_listener_local;
  error_logger_shptr_t *error_logger_local;
  timer_manager_factory_t *timer_factory_local;
  environment_t *env_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
  *this_local;
  
  local_38 = stats_distribution_mbox;
  stats_distribution_mbox_local = (mbox_t *)coop_listener;
  coop_listener_local = (coop_listener_unique_ptr_t *)error_logger;
  error_logger_local = (error_logger_shptr_t *)timer_factory;
  timer_factory_local = (timer_manager_factory_t *)env;
  env_local = (environment_t *)this;
  environment_infrastructure_t::environment_infrastructure_t
            (&this->super_environment_infrastructure_t);
  (this->super_environment_infrastructure_t)._vptr_environment_infrastructure_t =
       (_func_int **)&PTR__env_infrastructure_t_005c2ee0;
  this->m_env = (environment_t *)timer_factory_local;
  main_thread_sync_objects_t::main_thread_sync_objects_t(&this->m_sync_objects);
  std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::deque(&this->m_final_dereg_coops);
  this->m_shutdown_status = not_started;
  st_reusable_stuff::actual_elapsed_timers_collector_t::actual_elapsed_timers_collector_t
            (&this->m_timers_collector);
  std::shared_ptr<so_5::error_logger_t>::shared_ptr(local_58,error_logger);
  outliving_mutable<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t>
            (local_68,&this->m_timers_collector);
  outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t>::
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t>
            (&local_60,
             (outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t>
              *)local_68);
  std::
  function<std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>_(std::shared_ptr<so_5::error_logger_t>,_so_5::outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t>)>
  ::operator()((function<std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>_(std::shared_ptr<so_5::error_logger_t>,_so_5::outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t>)>
                *)&this->m_timer_manager,(shared_ptr<so_5::error_logger_t> *)timer_factory,
               (outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t> *)local_58)
  ;
  std::shared_ptr<so_5::error_logger_t>::~shared_ptr(local_58);
  event_queue_impl_t::event_queue_impl_t(&this->m_event_queue,&this->m_sync_objects);
  env_01 = timer_factory_local;
  std::unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>::unique_ptr
            (&local_70,coop_listener);
  st_reusable_stuff::coop_repo_t::coop_repo_t(&this->m_coop_repo,(environment_t *)env_01,&local_70);
  std::unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>::~unique_ptr
            (&local_70);
  outliving_mutable<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>
            ((so_5 *)&local_78,&this->m_event_queue);
  outliving_mutable<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
            ((so_5 *)&local_80,(fake_activity_tracker_t *)&this->field_0x260);
  st_reusable_stuff::
  default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>
  ::default_disp_impl_t(&this->m_default_disp,&local_78,&local_80);
  env_00 = this->m_env;
  intrusive_ptr_t<so_5::abstract_message_box_t>::intrusive_ptr_t(&local_88,stats_distribution_mbox);
  stats::impl::st_env_stuff::next_turn_mbox_t::make();
  st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>::stats_controller_t
            (&this->m_stats_controller,env_00,&local_88,&local_90);
  intrusive_ptr_t<so_5::abstract_message_box_t>::~intrusive_ptr_t(&local_90);
  intrusive_ptr_t<so_5::abstract_message_box_t>::~intrusive_ptr_t(&local_88);
  return;
}

Assistant:

env_infrastructure_t< ACTIVITY_TRACKER >::env_infrastructure_t(
	environment_t & env,
	timer_manager_factory_t timer_factory,
	error_logger_shptr_t error_logger,
	coop_listener_unique_ptr_t coop_listener,
	mbox_t stats_distribution_mbox )
	:	m_env( env )
	,	m_timer_manager(
			timer_factory(
				std::move(error_logger),
				outliving_mutable(m_timers_collector) ) )
	,	m_event_queue( m_sync_objects )
	,	m_coop_repo( env, std::move(coop_listener) )
	,	m_default_disp(
			outliving_mutable(m_event_queue),
			outliving_mutable(m_activity_tracker) )
	,	m_stats_controller(
			m_env,
			std::move(stats_distribution_mbox),
			stats::impl::st_env_stuff::next_turn_mbox_t::make() )
	{}